

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPartialDistribution.hpp
# Opt level: O1

PartialDistribution * __thiscall
njoy::ENDFtk::section::Type<5>::PartialDistribution::
readPartialDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (PartialDistribution *__return_storage_ptr__,PartialDistribution *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  void *pvVar1;
  undefined8 *puVar2;
  long lVar3;
  PartialDistribution *pPVar4;
  int MAT_00;
  Probability probability;
  long alStackY_368 [7];
  undefined1 *puStackY_330;
  PartialDistribution *apPStack_320 [2];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_310;
  GeneralEvaporationSpectrum local_308;
  Probability local_1e8;
  _Variadic_union<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
  local_158;
  undefined1 local_38;
  
  MAT_00 = (int)lineNumber;
  puStackY_330 = (undefined1 *)0x135859;
  apPStack_320[1] = __return_storage_ptr__;
  local_310 = end;
  Probability::Probability<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_1e8,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,begin,(long *)end,MAT_00,MAT,MF);
  switch((int)local_1e8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl) {
  case 1:
    puStackY_330 = (undefined1 *)0x135896;
    TabulatedSpectrum::TabulatedSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((TabulatedSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)local_310,MAT_00,MAT,MF);
    local_158._0_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
         super__Head_base<5UL,_long,_false>._M_head_impl;
    local_158._8_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    local_158._16_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    local_158._24_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    local_158._32_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    local_158._40_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    local_158._48_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    local_158._56_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    local_158._64_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._72_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_158._80_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_158._88_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._96_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._104_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._112_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 0;
    puStackY_330 = (undefined1 *)0x135936;
    PartialDistribution(apPStack_320[1],&local_1e8,(Distribution *)&local_158._M_first);
    puStackY_330 = (undefined1 *)0x13594b;
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                         *)&local_158._M_first);
    puStackY_330 = (undefined1 *)0x135953;
    std::
    vector<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
    ::~vector((vector<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
               *)&local_308.temperature_.super_TabulationRecord.xValues);
    if (local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
        interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      puStackY_330 = (undefined1 *)0x135969;
      operator_delete(local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                      interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                            interpolationSchemeIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                            interpolationSchemeIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pPVar4 = apPStack_320[1];
    if (local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      puStackY_330 = (undefined1 *)0x135984;
      operator_delete(local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                      boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                            boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                            boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
      pPVar4 = apPStack_320[1];
    }
    goto LAB_00135f8d;
  default:
    puStackY_330 = (undefined1 *)0x136022;
    tools::Log::error<char_const*>("Encountered illegal LF value");
    puStackY_330 = (undefined1 *)0x13602e;
    tools::Log::info<char_const*>("LF must be equal to 1, 5, 7, 9, 11 or 12");
    puStackY_330 = (undefined1 *)0x136041;
    tools::Log::info<char_const*,int>
              ("LF value: {}",
               (int)local_1e8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                    _M_head_impl);
    lVar3 = (long)local_1e8.super_TabulationRecord.xValues.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e8.super_TabulationRecord.xValues.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar3 = (SUB168(SEXT816(lVar3 + 2) * SEXT816(0x5555555555555555),8) - lVar3) + -2;
    puStackY_330 = (undefined1 *)0x1360c3;
    tools::Log::info<char_const*,long>
              ("Line number: {}",
               (long)(local_310->_M_current +
                     ((lVar3 >> 1) - (lVar3 >> 0x3f)) +
                     ~((((long)local_1e8.super_TabulationRecord.super_InterpolationBase.
                               boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1e8.super_TabulationRecord.super_InterpolationBase.
                               boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) + 2) / 3)));
    puStackY_330 = (undefined1 *)0x1360cd;
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = getenv;
    puStackY_330 = &LAB_001360f1;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  case 5:
    puStackY_330 = (undefined1 *)0x135a78;
    GeneralEvaporationSpectrum::
    GeneralEvaporationSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)local_310,MAT_00,MAT,MF);
    pPVar4 = apPStack_320[1];
    local_158._0_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
         super__Head_base<5UL,_long,_false>._M_head_impl;
    local_158._8_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    local_158._16_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    local_158._24_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    local_158._32_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    local_158._40_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    local_158._48_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    local_158._56_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    local_158._64_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._72_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_158._80_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_158._88_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._96_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._104_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._112_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._120_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._128_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._136_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._144_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
         super__Head_base<5UL,_long,_false>._M_head_impl;
    local_158._152_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    local_158._160_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    local_158._168_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    local_158._176_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    local_158._184_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    local_158._192_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    local_158._200_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    local_158._208_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.distribution_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.distribution_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.distribution_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._216_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_158._224_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_158._232_8_ =
         local_308.distribution_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_308.distribution_.super_TabulationRecord.super_InterpolationBase.
    interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.distribution_.super_TabulationRecord.super_InterpolationBase.
    interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.distribution_.super_TabulationRecord.super_InterpolationBase.
    interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158._240_8_ =
         local_308.distribution_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._248_8_ =
         local_308.distribution_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._256_8_ =
         local_308.distribution_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.distribution_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.distribution_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.distribution_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._264_8_ =
         local_308.distribution_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._272_8_ =
         local_308.distribution_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._280_8_ =
         local_308.distribution_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.distribution_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.distribution_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.distribution_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 1;
    puStackY_330 = (undefined1 *)0x135c2b;
    PartialDistribution(apPStack_320[1],&local_1e8,(Distribution *)&local_158._M_first);
    puStackY_330 = (undefined1 *)0x135c38;
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                         *)&local_158._M_first);
    puStackY_330 = (undefined1 *)0x135c42;
    GeneralEvaporationSpectrum::~GeneralEvaporationSpectrum(&local_308);
    goto LAB_00135f8d;
  case 7:
    puStackY_330 = (undefined1 *)0x135d58;
    MaxwellianFissionSpectrum::
    MaxwellianFissionSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((MaxwellianFissionSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)local_310,MAT_00,MAT,MF);
    pPVar4 = apPStack_320[1];
    local_158._0_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
         super__Head_base<5UL,_long,_false>._M_head_impl;
    local_158._8_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    local_158._16_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    local_158._24_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    local_158._32_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    local_158._40_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    local_158._48_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    local_158._56_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    local_158._64_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._72_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_158._80_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_158._88_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._96_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._104_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._112_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._120_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._128_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._136_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 2;
    puStackY_330 = (undefined1 *)0x135e26;
    PartialDistribution(apPStack_320[1],&local_1e8,(Distribution *)&local_158._M_first);
    break;
  case 9:
    puStackY_330 = (undefined1 *)0x135e4a;
    EvaporationSpectrum::
    EvaporationSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((EvaporationSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)local_310,MAT_00,MAT,MF);
    pPVar4 = apPStack_320[1];
    local_158._0_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
         super__Head_base<5UL,_long,_false>._M_head_impl;
    local_158._8_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    local_158._16_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    local_158._24_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    local_158._32_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    local_158._40_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    local_158._48_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    local_158._56_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    local_158._64_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._72_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_158._80_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_158._88_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._96_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._104_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._112_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._120_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._128_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._136_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 3;
    puStackY_330 = (undefined1 *)0x135f18;
    PartialDistribution(apPStack_320[1],&local_1e8,(Distribution *)&local_158._M_first);
    break;
  case 0xb:
    puStackY_330 = (undefined1 *)0x1359a8;
    WattSpectrum::WattSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((WattSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)local_310,MAT_00,MAT,MF);
    puStackY_330 = (undefined1 *)0x1359bd;
    std::__detail::__variant::_Uninitialized<njoy::ENDFtk::section::Type<5>::WattSpectrum,_false>::
    _Uninitialized<njoy::ENDFtk::section::Type<5>::WattSpectrum>
              ((_Uninitialized<njoy::ENDFtk::section::Type<5>::WattSpectrum,_false> *)&local_158,
               &local_308);
    local_38 = 4;
    puStackY_330 = (undefined1 *)0x1359d9;
    PartialDistribution(apPStack_320[1],&local_1e8,(Distribution *)&local_158._M_first);
    puStackY_330 = (undefined1 *)0x1359e6;
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                         *)&local_158._M_first);
    lVar3 = 0x120;
    do {
      pvVar1 = *(void **)((long)apPStack_320 + lVar3);
      if (pvVar1 != (void *)0x0) {
        puStackY_330 = (undefined1 *)0x135a02;
        operator_delete(pvVar1,*(long *)((long)&local_310 + lVar3) - (long)pvVar1);
      }
      pvVar1 = *(void **)((long)alStackY_368 + lVar3 + 0x30);
      if (pvVar1 != (void *)0x0) {
        puStackY_330 = (undefined1 *)0x135a18;
        operator_delete(pvVar1,*(long *)(&stack0xfffffffffffffcd8 + lVar3) - (long)pvVar1);
      }
      pvVar1 = *(void **)((long)alStackY_368 + lVar3 + 0x18);
      if (pvVar1 != (void *)0x0) {
        puStackY_330 = (undefined1 *)0x135a2f;
        operator_delete(pvVar1,*(long *)((long)alStackY_368 + lVar3 + 0x28) - (long)pvVar1);
      }
      pvVar1 = *(void **)((long)alStackY_368 + lVar3);
      if (pvVar1 != (void *)0x0) {
        puStackY_330 = (undefined1 *)0x135a46;
        operator_delete(pvVar1,*(long *)((long)alStackY_368 + lVar3 + 0x10) - (long)pvVar1);
      }
      lVar3 = lVar3 + -0x90;
      pPVar4 = apPStack_320[1];
    } while (lVar3 != 0);
    goto LAB_00135f8d;
  case 0xc:
    puStackY_330 = (undefined1 *)0x135c66;
    MadlandNixSpectrum::MadlandNixSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((MadlandNixSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)local_310,MAT_00,MAT,MF);
    pPVar4 = apPStack_320[1];
    local_158._0_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
         super__Head_base<5UL,_long,_false>._M_head_impl;
    local_158._8_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    local_158._16_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    local_158._24_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    local_158._32_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    local_158._40_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    local_158._48_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    local_158._56_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    local_158._64_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._72_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_158._80_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_158._88_8_ =
         local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices
    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._96_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._104_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._112_8_ =
         local_308.temperature_.super_TabulationRecord.xValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.xValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158._120_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_158._128_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_158._136_8_ =
         local_308.temperature_.super_TabulationRecord.yValues.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_308.temperature_.super_TabulationRecord.yValues.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 5;
    puStackY_330 = (undefined1 *)0x135d34;
    PartialDistribution(apPStack_320[1],&local_1e8,(Distribution *)&local_158._M_first);
  }
  puStackY_330 = (undefined1 *)0x135f25;
  std::__detail::__variant::
  _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
  ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                       *)&local_158._M_first);
  if (local_308.temperature_.super_TabulationRecord.yValues.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    puStackY_330 = (undefined1 *)0x135f42;
    operator_delete(local_308.temperature_.super_TabulationRecord.yValues.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.temperature_.super_TabulationRecord.yValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.temperature_.super_TabulationRecord.yValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.temperature_.super_TabulationRecord.xValues.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    puStackY_330 = (undefined1 *)0x135f5f;
    operator_delete(local_308.temperature_.super_TabulationRecord.xValues.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.temperature_.super_TabulationRecord.xValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.temperature_.super_TabulationRecord.xValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
      interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    puStackY_330 = (undefined1 *)0x135f76;
    operator_delete(local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                    interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308.temperature_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    puStackY_330 = (undefined1 *)0x135f8d;
    operator_delete(local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                    boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                          boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.temperature_.super_TabulationRecord.super_InterpolationBase.
                          boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00135f8d:
  if (local_1e8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    puStackY_330 = (undefined1 *)0x135faa;
    operator_delete(local_1e8.super_TabulationRecord.yValues.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super_TabulationRecord.yValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super_TabulationRecord.yValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    puStackY_330 = (undefined1 *)0x135fc7;
    operator_delete(local_1e8.super_TabulationRecord.xValues.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super_TabulationRecord.xValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super_TabulationRecord.xValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    puStackY_330 = (undefined1 *)0x135fe4;
    operator_delete(local_1e8.super_TabulationRecord.super_InterpolationBase.
                    interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    puStackY_330 = (undefined1 *)0x136001;
    operator_delete(local_1e8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_1e8.super_TabulationRecord.super_InterpolationBase.
                                   boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)local_1e8.super_TabulationRecord.super_InterpolationBase.
                                   boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
  }
  return pPVar4;
}

Assistant:

static PartialDistribution
readPartialDistribution( Iterator& begin,
                         const Iterator& end,
                         long& lineNumber,
                         int MAT,
                         int MF,
                         int MT ) {

  Probability probability( begin, end, lineNumber, MAT, MF, MT );
  switch ( probability.LF() ) {
    case 1 :
      return PartialDistribution
             ( std::move( probability ),
               TabulatedSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 5 :
      return PartialDistribution
             ( std::move( probability ),
               GeneralEvaporationSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 7 :
      return PartialDistribution
             ( std::move( probability ),
               MaxwellianFissionSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 9 :
      return PartialDistribution
             ( std::move( probability ),
               EvaporationSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 11 :
      return PartialDistribution
             ( std::move( probability ),
               WattSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 12 :
      return PartialDistribution
             ( std::move( probability ),
               MadlandNixSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    default : {
      Log::error( "Encountered illegal LF value" );
      Log::info( "LF must be equal to 1, 5, 7, 9, 11 or 12" );
      Log::info( "LF value: {}", probability.LF() );
      Log::info( "Line number: {}", lineNumber - probability.NC() );
      throw std::exception();
    }
  }
}